

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

AABox * __thiscall Triangle::boundingVolume(Triangle *this)

{
  float *pfVar1;
  long in_RSI;
  AABox *in_RDI;
  AABox *v;
  
  AABox::AABox(in_RDI);
  pfVar1 = std::min<float>((float *)(in_RSI + 0x14),(float *)(in_RSI + 0x20));
  pfVar1 = std::min<float>((float *)(in_RSI + 8),pfVar1);
  in_RDI->x1 = *pfVar1;
  pfVar1 = std::max<float>((float *)(in_RSI + 0x14),(float *)(in_RSI + 0x20));
  pfVar1 = std::max<float>((float *)(in_RSI + 8),pfVar1);
  in_RDI->x2 = *pfVar1;
  pfVar1 = std::min<float>((float *)(in_RSI + 0x18),(float *)(in_RSI + 0x24));
  pfVar1 = std::min<float>((float *)(in_RSI + 0xc),pfVar1);
  in_RDI->y1 = *pfVar1;
  pfVar1 = std::max<float>((float *)(in_RSI + 0x18),(float *)(in_RSI + 0x24));
  pfVar1 = std::max<float>((float *)(in_RSI + 0xc),pfVar1);
  in_RDI->y2 = *pfVar1;
  pfVar1 = std::min<float>((float *)(in_RSI + 0x1c),(float *)(in_RSI + 0x28));
  pfVar1 = std::min<float>((float *)(in_RSI + 0x10),pfVar1);
  in_RDI->z1 = *pfVar1;
  pfVar1 = std::max<float>((float *)(in_RSI + 0x1c),(float *)(in_RSI + 0x28));
  pfVar1 = std::max<float>((float *)(in_RSI + 0x10),pfVar1);
  in_RDI->z2 = *pfVar1;
  return in_RDI;
}

Assistant:

AABox boundingVolume() const
	{
		AABox v;
		v.x1 = std::min(v1.x, std::min(v2.x, v3.x));
		v.x2 = std::max(v1.x, std::max(v2.x, v3.x));
		v.y1 = std::min(v1.y, std::min(v2.y, v3.y));
		v.y2 = std::max(v1.y, std::max(v2.y, v3.y));
		v.z1 = std::min(v1.z, std::min(v2.z, v3.z));
		v.z2 = std::max(v1.z, std::max(v2.z, v3.z));
		return v;
	}